

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaussian_mixture_modeling.cc
# Opt level: O2

bool __thiscall
sptk::GaussianMixtureModeling::Run
          (GaussianMixtureModeling *this,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *input_vectors,vector<double,_std::allocator<double>_> *weights,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *mean_vectors,
          vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *covariance_matrices
          ,double *total_log_likelihood)

{
  SymmetricMatrix *pSVar1;
  double dVar2;
  InitializationType IVar3;
  pointer pdVar4;
  pointer pvVar5;
  GaussianMixtureModeling *pGVar6;
  bool bVar7;
  undefined1 uVar8;
  int iVar9;
  uint uVar10;
  pointer pdVar11;
  double *pdVar12;
  double dVar13;
  ostream *poVar14;
  long lVar15;
  size_type __new_size;
  int iVar16;
  ulong uVar17;
  int l_2;
  int l_1;
  ulong uVar18;
  int k_1;
  int iVar19;
  long lVar20;
  int k;
  long lVar21;
  Row local_1f8;
  double local_1e0;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *local_1d8;
  double local_1d0;
  double local_1c8;
  double local_1c0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_1b8;
  double local_1b0;
  double local_1a8;
  double local_1a0;
  GaussianMixtureModeling *local_198;
  undefined4 local_18c;
  vector<double,_std::allocator<double>_> buffer0;
  double local_160;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  buffer1;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> buffer2;
  double denominator;
  pointer local_120;
  int local_118;
  double local_110;
  double *local_108;
  long local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  vector<double,_std::allocator<double>_> numerators;
  Buffer buffer;
  
  if (this->is_valid_ == true) {
    if (total_log_likelihood == (double *)0x0) {
      return (bool)0;
    }
    if (covariance_matrices ==
        (vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *)0x0) {
      return (bool)0;
    }
    if (mean_vectors ==
        (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         *)0x0) {
      return (bool)0;
    }
    if (weights == (vector<double,_std::allocator<double>_> *)0x0) {
      return (bool)0;
    }
    if ((input_vectors->
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start ==
        (input_vectors->
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      return (bool)0;
    }
    __new_size = (long)this->num_order_ + 1;
    IVar3 = this->initialization_type_;
    iVar9 = (int)__new_size;
    local_1d8 = covariance_matrices;
    local_1b8 = input_vectors;
    if (IVar3 == kUbm) {
      std::vector<double,_std::allocator<double>_>::operator=(weights,&this->ubm_weights_);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator=(mean_vectors,&this->ubm_mean_vectors_);
      std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::operator=
                (local_1d8,&this->ubm_covariance_matrices_);
    }
    else {
      if (IVar3 == kKMeans) {
        bVar7 = Initialize(this,input_vectors,weights,mean_vectors,covariance_matrices);
      }
      else {
        if (IVar3 != kNone) goto LAB_00106d64;
        bVar7 = anon_unknown.dwarf_170d7::CheckGmm
                          (this->num_mixture_,iVar9,weights,mean_vectors,covariance_matrices);
      }
      if (bVar7 == false) goto LAB_00106d64;
    }
    local_108 = total_log_likelihood;
    std::vector<double,_std::allocator<double>_>::vector
              (&buffer0,(long)this->num_mixture_,(allocator_type *)&buffer);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector(&buffer1,(long)this->num_mixture_,(allocator_type *)&buffer);
    lVar20 = 0;
    for (lVar21 = 0; lVar21 < this->num_mixture_; lVar21 = lVar21 + 1) {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&((buffer1.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar20),__new_size);
      lVar20 = lVar20 + 0x18;
    }
    std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::vector
              (&buffer2,(long)this->num_mixture_,(allocator_type *)&buffer);
    lVar20 = 0;
    for (lVar21 = 0; lVar21 < this->num_mixture_; lVar21 = lVar21 + 1) {
      SymmetricMatrix::Resize
                ((SymmetricMatrix *)
                 ((long)&(buffer2.
                          super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_vptr_SymmetricMatrix + lVar20
                 ),iVar9);
      lVar20 = lVar20 + 0x40;
    }
    buffer._vptr_Buffer = (_func_int **)&PTR__Buffer_00119be8;
    buffer.d_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    buffer.d_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    buffer.d_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    buffer.gconsts_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    buffer.gconsts_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    buffer.gconsts_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    buffer.precisions_.
    super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    buffer.precisions_.
    super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    buffer.precisions_.
    super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>._M_impl.
    super__Vector_impl_data._M_finish._1_7_ = 0;
    buffer.precisions_.
    super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    buffer._73_8_ = 0;
    std::vector<double,_std::allocator<double>_>::vector
              (&numerators,(long)this->num_mixture_,(allocator_type *)&local_1f8);
    pSVar1 = &this->mask_;
    local_160 = -1.79769313486232e+308;
    uVar17 = 1;
    local_198 = this;
    while( true ) {
      iVar9 = (int)uVar17;
      local_18c = (undefined4)CONCAT71((int7)(uVar17 >> 8),1);
      pdVar11 = buffer0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (this->num_iteration_ < iVar9) break;
      for (; pdVar11 !=
             buffer0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish; pdVar11 = pdVar11 + 1) {
        *pdVar11 = 0.0;
      }
      for (lVar20 = 0; uVar17 = (ulong)this->num_mixture_, lVar20 < (long)uVar17;
          lVar20 = lVar20 + 1) {
        pdVar4 = buffer1.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar20].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_finish;
        for (pdVar11 = buffer1.
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar20].
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start; pdVar11 != pdVar4; pdVar11 = pdVar11 + 1) {
          *pdVar11 = 0.0;
        }
        SymmetricMatrix::Fill
                  (buffer2.
                   super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar20,0.0);
      }
      buffer._73_8_ = buffer._73_8_ & 0xffffffffffffff;
      local_1b0 = (double)(((long)(local_1b8->
                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                           (long)(local_1b8->
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start) / 0x18);
      local_1a8 = 0.0;
      if (0 < SUB84(local_1b0,0)) {
        local_1a8 = (double)((ulong)local_1b0 & 0xffffffff);
      }
      local_1d0 = 0.0;
      dVar13 = 0.0;
      while (iVar16 = (int)uVar17, dVar13 != local_1a8) {
        local_1a0 = dVar13;
        bVar7 = CalculateLogProbability
                          (this->num_order_,iVar16,this->is_diagonal_,false,
                           (local_1b8->
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + (long)dVar13,weights,
                           mean_vectors,local_1d8,&numerators,&denominator,&buffer);
        if (!bVar7) {
          local_18c = 0;
          goto LAB_00107938;
        }
        local_1d0 = local_1d0 + denominator;
        lVar20 = *(long *)&(local_1b8->
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start[(long)dVar13].
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data;
        for (lVar21 = 0; uVar17 = (ulong)this->num_mixture_, lVar21 < (long)uVar17;
            lVar21 = lVar21 + 1) {
          local_1c8 = exp(numerators.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar21] - denominator);
          buffer0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar21] =
               buffer0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar21] + local_1c8;
          iVar16 = this->num_order_;
          for (lVar15 = 0; lVar15 <= iVar16; lVar15 = lVar15 + 1) {
            pdVar11 = buffer1.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar21].
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pdVar11[lVar15] = *(double *)(lVar20 + lVar15 * 8) * local_1c8 + pdVar11[lVar15];
          }
          for (uVar17 = 0; (long)uVar17 <= (long)this->num_order_; uVar17 = uVar17 + 1) {
            uVar18 = uVar17 & 0xffffffff;
            if (this->is_diagonal_ == false) {
              uVar18 = 0;
            }
            for (; uVar18 <= uVar17; uVar18 = uVar18 + 1) {
              local_1f8._vptr_Row = (_func_int **)&PTR__Row_00119b58;
              local_1f8.matrix_ = pSVar1;
              local_1f8.row_ = (int)uVar17;
              pdVar12 = SymmetricMatrix::Row::operator[](&local_1f8,(int)uVar18);
              if ((*pdVar12 != 0.0) || (NAN(*pdVar12))) {
                local_1e0 = *(double *)(lVar20 + uVar17 * 8);
                local_1f8.matrix_ =
                     buffer2.
                     super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar21;
                local_1c0 = *(double *)(lVar20 + uVar18 * 8);
                local_1f8._vptr_Row = (_func_int **)&PTR__Row_00119b58;
                local_1f8.row_ = (int)uVar17;
                pdVar12 = SymmetricMatrix::Row::operator[](&local_1f8,(int)uVar18);
                *pdVar12 = local_1e0 * local_1c8 * local_1c0 + *pdVar12;
              }
            }
            this = local_198;
          }
        }
        dVar13 = (double)((long)local_1a0 + 1);
      }
      dVar13 = this->smoothing_parameter_;
      local_110 = (double)local_1b0._0_4_;
      if ((dVar13 != 0.0) || (NAN(dVar13))) {
        pdVar11 = (this->xi_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar17 = uVar17 & 0xffffffff;
        if (iVar16 < 1) {
          uVar17 = 0;
        }
        for (uVar18 = 0; uVar17 != uVar18; uVar18 = uVar18 + 1) {
          (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar18] =
               (buffer0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar18] + pdVar11[uVar18]) *
               (1.0 / (dVar13 + local_110));
        }
      }
      else {
        uVar17 = uVar17 & 0xffffffff;
        if (iVar16 < 1) {
          uVar17 = 0;
        }
        for (uVar18 = 0; uVar17 != uVar18; uVar18 = uVar18 + 1) {
          (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar18] =
               buffer0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar18] * (1.0 / local_110);
        }
      }
      FloorWeight(this,weights);
      uVar10 = this->num_mixture_;
      if ((this->smoothing_parameter_ != 0.0) || (NAN(this->smoothing_parameter_))) {
        pdVar11 = (this->xi_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        iVar16 = this->num_order_;
        uVar17 = 0;
        if (0 < (int)uVar10) {
          uVar17 = (ulong)uVar10;
        }
        for (uVar18 = 0; uVar18 != uVar17; uVar18 = uVar18 + 1) {
          dVar13 = buffer0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar18];
          dVar2 = pdVar11[uVar18];
          lVar20 = *(long *)&(mean_vectors->
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[uVar18].
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data;
          pvVar5 = (this->ubm_mean_vectors_).
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          for (lVar21 = 0; lVar21 <= iVar16; lVar21 = lVar21 + 1) {
            *(double *)(lVar20 + lVar21 * 8) =
                 (pdVar11[uVar18] *
                  *(double *)
                   (*(long *)&pvVar5[uVar18].super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data + lVar21 * 8) +
                 buffer1.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar18].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar21]) * (1.0 / (dVar13 + dVar2));
            this = local_198;
          }
        }
      }
      else {
        iVar16 = this->num_order_;
        uVar17 = 0;
        if (0 < (int)uVar10) {
          uVar17 = (ulong)uVar10;
        }
        for (uVar18 = 0; uVar18 != uVar17; uVar18 = uVar18 + 1) {
          dVar13 = buffer0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar18];
          lVar20 = *(long *)&(mean_vectors->
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[uVar18].
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data;
          for (lVar21 = 0; lVar21 <= iVar16; lVar21 = lVar21 + 1) {
            *(double *)(lVar20 + lVar21 * 8) =
                 buffer1.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar18].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar21] * (1.0 / dVar13);
          }
        }
      }
      if ((this->smoothing_parameter_ != 0.0) || (NAN(this->smoothing_parameter_))) {
        for (lVar20 = 0; lVar20 < (int)uVar10; lVar20 = lVar20 + 1) {
          local_1e0 = (double)(lVar20 * 0x18);
          local_1c0 = *(double *)
                       &(mean_vectors->
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start[lVar20].
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data;
          local_f8 = 1.0 / (buffer0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar20] +
                           (this->xi_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar20]);
          local_100 = lVar20;
          for (uVar17 = 0; (long)uVar17 <= (long)this->num_order_; uVar17 = uVar17 + 1) {
            uVar18 = uVar17 & 0xffffffff;
            if (this->is_diagonal_ == false) {
              uVar18 = 0;
            }
            for (; uVar18 <= uVar17; uVar18 = uVar18 + 1) {
              local_1f8._vptr_Row = (_func_int **)&PTR__Row_00119b58;
              iVar19 = (int)uVar17;
              iVar16 = (int)uVar18;
              local_1f8.matrix_ = pSVar1;
              local_1f8.row_ = iVar19;
              pdVar12 = SymmetricMatrix::Row::operator[](&local_1f8,iVar16);
              if ((*pdVar12 != 0.0) || (NAN(*pdVar12))) {
                lVar21 = *(long *)((long)&((buffer1.
                                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->
                                          super__Vector_base<double,_std::allocator<double>_>).
                                          _M_impl.super__Vector_impl_data._M_start + (long)local_1e0
                                  );
                local_1c8 = *(double *)(lVar21 + uVar17 * 8);
                local_1a8 = buffer0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar20];
                local_1a0 = *(double *)(lVar21 + uVar18 * 8);
                local_1f8.matrix_ =
                     buffer2.
                     super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar20;
                local_1f8._vptr_Row = (_func_int **)&PTR__Row_00119b58;
                local_1f8.row_ = iVar19;
                pdVar12 = SymmetricMatrix::Row::operator[](&local_1f8,iVar16);
                pGVar6 = local_198;
                local_a8 = *pdVar12;
                local_b0 = buffer0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar20];
                local_c0 = *(double *)((long)local_1c0 + uVar18 * 8);
                local_b8 = *(double *)((long)local_1c0 + uVar17 * 8);
                local_1b0 = (local_198->xi_).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[lVar20];
                local_1f8.matrix_ =
                     (local_198->ubm_covariance_matrices_).
                     super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar20;
                local_1f8._vptr_Row = (_func_int **)&PTR__Row_00119b58;
                local_1f8.row_ = iVar19;
                pdVar12 = SymmetricMatrix::Row::operator[](&local_1f8,iVar16);
                local_e0 = *pdVar12;
                local_d0 = (pGVar6->xi_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                           .super__Vector_impl_data._M_start[lVar20];
                lVar21 = *(long *)((long)&(((pGVar6->ubm_mean_vectors_).
                                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->
                                          super__Vector_base<double,_std::allocator<double>_>).
                                          _M_impl.super__Vector_impl_data + (long)local_1e0);
                local_d8 = *(double *)(lVar21 + uVar17 * 8);
                local_e8 = *(double *)((long)local_1c0 + uVar17 * 8);
                local_c8 = *(double *)(lVar21 + uVar18 * 8);
                local_1f8.matrix_ =
                     (local_1d8->
                     super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                     )._M_impl.super__Vector_impl_data._M_start + lVar20;
                local_f0 = *(double *)((long)local_1c0 + uVar18 * 8);
                local_1f8._vptr_Row = (_func_int **)&PTR__Row_00119b58;
                local_1f8.row_ = iVar19;
                pdVar12 = SymmetricMatrix::Row::operator[](&local_1f8,iVar16);
                *pdVar12 = ((local_c8 - local_f0) * local_d0 * (local_d8 - local_e8) +
                           local_1b0 * local_e0 +
                           (local_a8 -
                           local_b0 *
                           (((local_1c8 / local_1a8) * local_c0 + (local_1a0 / local_1a8) * local_b8
                            ) - local_b8 * local_c0))) * local_f8;
                lVar20 = local_100;
              }
            }
            this = local_198;
          }
          uVar10 = this->num_mixture_;
        }
      }
      else {
        for (dVar13 = 0.0; (long)dVar13 < (long)(int)uVar10; dVar13 = (double)((long)dVar13 + 1)) {
          local_1a0 = *(double *)
                       &(mean_vectors->
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start[(long)dVar13].
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data;
          local_1a8 = 1.0 / buffer0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[(long)dVar13];
          local_1b0 = dVar13;
          for (uVar17 = 0; (long)uVar17 <= (long)this->num_order_; uVar17 = uVar17 + 1) {
            uVar18 = uVar17 & 0xffffffff;
            if (this->is_diagonal_ == false) {
              uVar18 = 0;
            }
            for (; uVar18 <= uVar17; uVar18 = uVar18 + 1) {
              local_1f8._vptr_Row = (_func_int **)&PTR__Row_00119b58;
              iVar19 = (int)uVar17;
              iVar16 = (int)uVar18;
              local_1f8.matrix_ = pSVar1;
              local_1f8.row_ = iVar19;
              pdVar12 = SymmetricMatrix::Row::operator[](&local_1f8,iVar16);
              if ((*pdVar12 != 0.0) || (NAN(*pdVar12))) {
                local_1f8.matrix_ =
                     buffer2.
                     super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                     ._M_impl.super__Vector_impl_data._M_start + (long)dVar13;
                local_1f8._vptr_Row = (_func_int **)&PTR__Row_00119b58;
                local_1f8.row_ = iVar19;
                pdVar12 = SymmetricMatrix::Row::operator[](&local_1f8,iVar16);
                local_1e0 = *pdVar12;
                local_1c0 = *(double *)((long)local_1a0 + uVar17 * 8);
                local_120 = (local_1d8->
                            super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                            )._M_impl.super__Vector_impl_data._M_start + (long)dVar13;
                local_1c8 = *(double *)((long)local_1a0 + uVar18 * 8);
                denominator = (double)&PTR__Row_00119b58;
                local_118 = iVar19;
                pdVar12 = SymmetricMatrix::Row::operator[]((Row *)&denominator,iVar16);
                *pdVar12 = local_1e0 * local_1a8 - local_1c8 * local_1c0;
                dVar13 = local_1b0;
              }
            }
            this = local_198;
          }
          uVar10 = this->num_mixture_;
        }
      }
      FloorVariance(this,local_1d8);
      *local_108 = local_1d0;
      local_1d0 = local_1d0 / local_110;
      local_1e0 = local_1d0 - local_160;
      if (iVar9 % this->log_interval_ == 0) {
        poVar14 = std::operator<<((ostream *)&std::cerr,"iter ");
        *(undefined8 *)(poVar14 + *(long *)(*(long *)poVar14 + -0x18) + 0x10) = 3;
        poVar14 = (ostream *)std::ostream::operator<<((ostream *)poVar14,iVar9);
        std::operator<<(poVar14," : ");
        std::operator<<((ostream *)&std::cerr,"average = ");
        std::ostream::_M_insert<double>(local_1d0);
        poVar14 = (ostream *)&std::cerr;
        if (iVar9 != 1) {
          std::operator<<((ostream *)&std::cerr,", change = ");
          poVar14 = std::ostream::_M_insert<double>(local_1e0);
        }
        std::endl<char,std::char_traits<char>>(poVar14);
      }
      uVar17 = (ulong)(iVar9 + 1);
      local_160 = local_1d0;
      if (local_1e0 < this->convergence_threshold_) break;
    }
LAB_00107938:
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&numerators.super__Vector_base<double,_std::allocator<double>_>);
    Buffer::~Buffer(&buffer);
    std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::~vector(&buffer2);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&buffer1);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&buffer0.super__Vector_base<double,_std::allocator<double>_>);
    uVar8 = (undefined1)local_18c;
  }
  else {
LAB_00106d64:
    uVar8 = 0;
  }
  return (bool)uVar8;
}

Assistant:

bool GaussianMixtureModeling::Run(
    const std::vector<std::vector<double> >& input_vectors,
    std::vector<double>* weights,
    std::vector<std::vector<double> >* mean_vectors,
    std::vector<SymmetricMatrix>* covariance_matrices,
    double* total_log_likelihood) const {
  // Check inputs.
  if (!is_valid_ || input_vectors.empty() || NULL == weights ||
      NULL == mean_vectors || NULL == covariance_matrices ||
      NULL == total_log_likelihood) {
    return false;
  }

  // Initialize GMM parameters.
  const int length(num_order_ + 1);
  switch (initialization_type_) {
    case kNone: {
      if (!CheckGmm(num_mixture_, length, *weights, *mean_vectors,
                    *covariance_matrices)) {
        return false;
      }
      break;
    }
    case kKMeans: {
      if (!Initialize(input_vectors, weights, mean_vectors,
                      covariance_matrices)) {
        return false;
      }
      break;
    }
    case kUbm: {
      *weights = ubm_weights_;
      *mean_vectors = ubm_mean_vectors_;
      *covariance_matrices = ubm_covariance_matrices_;
      break;
    }
    default: {
      return false;
    }
  }

  // Prepare memories.
  std::vector<double> buffer0(num_mixture_);
  std::vector<std::vector<double> > buffer1(num_mixture_);
  for (int k(0); k < num_mixture_; ++k) {
    buffer1[k].resize(length);
  }
  std::vector<SymmetricMatrix> buffer2(num_mixture_);
  for (int k(0); k < num_mixture_; ++k) {
    buffer2[k].Resize(length);
  }
  GaussianMixtureModeling::Buffer buffer;
  std::vector<double> numerators(num_mixture_);

  double prev_log_likelihood(sptk::kMin);

  for (int n(1); n <= num_iteration_; ++n) {
    // Clear buffers.
    std::fill(buffer0.begin(), buffer0.end(), 0.0);
    for (int k(0); k < num_mixture_; ++k) {
      std::fill(buffer1[k].begin(), buffer1[k].end(), 0.0);
      buffer2[k].Fill(0.0);
    }
    buffer.precomputed_ = false;

    // Perform E-step.
    double log_likelihood(0.0);
    const int num_data(static_cast<int>(input_vectors.size()));
    for (int t(0); t < num_data; ++t) {
      // Compute log-likelihood of data.
      double denominator;
      if (!CalculateLogProbability(num_order_, num_mixture_, is_diagonal_,
                                   false, input_vectors[t], *weights,
                                   *mean_vectors, *covariance_matrices,
                                   &numerators, &denominator, &buffer)) {
        return false;
      }
      log_likelihood += denominator;

      const double* x(&(input_vectors[t][0]));
      for (int k(0); k < num_mixture_; ++k) {
        const double posterior(std::exp(numerators[k] - denominator));

        // Accumulate zeroth-order statistics.
        buffer0[k] += posterior;

        // Accumulate first-order statistics.
        for (int l(0); l <= num_order_; ++l) {
          buffer1[k][l] += posterior * x[l];
        }

        // Accumulate second-order statistics.
        for (int l(0); l <= num_order_; ++l) {
          for (int m(is_diagonal_ ? l : 0); m <= l; ++m) {
            if (0.0 != mask_[l][m]) {
              buffer2[k][l][m] += posterior * x[l] * x[m];
            }
          }
        }
      }
    }

    // Update mixture weights.
    if (0.0 == smoothing_parameter_) {
      const double z(1.0 / num_data);
      for (int k(0); k < num_mixture_; ++k) {
        (*weights)[k] = buffer0[k] * z;
      }
    } else {
      const double z(1.0 / (num_data + smoothing_parameter_));
      for (int k(0); k < num_mixture_; ++k) {
        (*weights)[k] = (buffer0[k] + xi_[k]) * z;
      }
    }
    FloorWeight(weights);

    // Update mean vectors.
    if (0.0 == smoothing_parameter_) {
      for (int k(0); k < num_mixture_; ++k) {
        double* mu(&((*mean_vectors)[k][0]));
        const double z(1.0 / buffer0[k]);
        for (int l(0); l <= num_order_; ++l) {
          mu[l] = buffer1[k][l] * z;
        }
      }
    } else {
      for (int k(0); k < num_mixture_; ++k) {
        double* mu(&((*mean_vectors)[k][0]));
        const double z(1.0 / (buffer0[k] + xi_[k]));
        for (int l(0); l <= num_order_; ++l) {
          mu[l] = (buffer1[k][l] + xi_[k] * ubm_mean_vectors_[k][l]) * z;
        }
      }
    }

    // Update covariance matrices.
    if (0.0 == smoothing_parameter_) {
      for (int k(0); k < num_mixture_; ++k) {
        const double* mu(&((*mean_vectors)[k][0]));
        const double z(1.0 / buffer0[k]);
        for (int l(0); l <= num_order_; ++l) {
          for (int m(is_diagonal_ ? l : 0); m <= l; ++m) {
            if (0.0 != mask_[l][m]) {
              (*covariance_matrices)[k][l][m] =
                  buffer2[k][l][m] * z - (mu[l] * mu[m]);
            }
          }
        }
      }
    } else {
      for (int k(0); k < num_mixture_; ++k) {
        const double* mu(&((*mean_vectors)[k][0]));
        const double z(1.0 / (buffer0[k] + xi_[k]));
        for (int l(0); l <= num_order_; ++l) {
          for (int m(is_diagonal_ ? l : 0); m <= l; ++m) {
            if (0.0 != mask_[l][m]) {
              const double mu_l(buffer1[k][l] / buffer0[k]);
              const double mu_m(buffer1[k][m] / buffer0[k]);
              const double a(buffer2[k][l][m] -
                             buffer0[k] *
                                 (mu_l * mu[m] + mu[l] * mu_m - mu[l] * mu[m]));
              const double b(xi_[k] * ubm_covariance_matrices_[k][l][m]);
              const double c(xi_[k] * (ubm_mean_vectors_[k][l] - mu[l]) *
                             (ubm_mean_vectors_[k][m] - mu[m]));
              (*covariance_matrices)[k][l][m] = (a + b + c) * z;
            }
          }
        }
      }
    }
    FloorVariance(covariance_matrices);

    // Check convergence.
    *total_log_likelihood = log_likelihood;
    log_likelihood /= num_data;
    const double change(log_likelihood - prev_log_likelihood);
    if (0 == n % log_interval_) {
      std::cerr << "iter " << std::setw(3) << n << " : ";
      std::cerr << "average = " << log_likelihood;
      if (1 == n) {
        std::cerr << std::endl;
      } else {
        std::cerr << ", change = " << change << std::endl;
      }
    }
    if (change < convergence_threshold_) {
      break;
    }
    prev_log_likelihood = log_likelihood;
  }

  return true;
}